

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_load_image_from_hdr_file_data
          (rf_image *__return_storage_ptr__,void *src,rf_int src_size,rf_allocator allocator,
          rf_allocator temp_allocator)

{
  rf_source_location rVar1;
  rf_source_location source_location;
  rf_source_location source_location_00;
  rf_source_location rVar2;
  rf_allocator_args rVar3;
  undefined1 auVar4 [24];
  uint uVar5;
  uint uVar6;
  stbi_uc *__src;
  void *__dest;
  rf_pixel_format rVar7;
  rf_allocator_proc *prVar8;
  size_t __n;
  long in_FS_OFFSET;
  int bpp;
  int height;
  int width;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  char *local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  stbi_uc *local_d0;
  undefined8 uStack_c8;
  undefined4 local_c0;
  uint uStack_bc;
  char *local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  char *local_a0;
  char *pcStack_98;
  undefined8 local_90;
  undefined8 local_88;
  size_t sStack_80;
  undefined4 local_78;
  uint uStack_74;
  char *local_70;
  char *pcStack_68;
  undefined8 local_60;
  rf_allocator local_58;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  prVar8 = allocator.allocator_proc;
  local_58.user_data = allocator.user_data;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  local_58.allocator_proc = prVar8;
  if (src_size == 0 || src == (void *)0x0) {
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_40 = "rf_load_image_from_hdr_file_data";
    local_38 = 0x3cf9;
    rf_log_impl(8,0x17aebd,(char *)0x1);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_load_image_from_hdr_file_data";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3cf9;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
    return __return_storage_ptr__;
  }
  local_ec = 0;
  local_f0 = 0;
  local_f4 = 0;
  *(void **)(in_FS_OFFSET + -0x430) = temp_allocator.user_data;
  *(rf_allocator_proc **)(in_FS_OFFSET + -0x428) = temp_allocator.allocator_proc;
  __src = stbi_load_from_memory
                    ((stbi_uc *)src,(int)src_size,(int *)&local_ec,(int *)&local_f0,(int *)&local_f4
                     ,0);
  uVar6 = local_ec;
  uVar5 = local_f0;
  *(undefined8 *)(in_FS_OFFSET + -0x430) = 0;
  *(undefined8 *)(in_FS_OFFSET + -0x428) = 0;
  if (local_f4 == 0 || __src == (stbi_uc *)0x0) {
    local_e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_e0 = "rf_load_image_from_hdr_file_data";
    local_d8 = 0x3cf7;
    source_location.proc_name._0_4_ = 0x17afb9;
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.proc_name._4_4_ = 0;
    source_location.line_in_file = 0x3cf7;
    rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                "File format not supported or could not be loaded. STB Image returned { x: %d, y: %d, channels: %d }"
                ,7,(ulong)local_ec,(ulong)local_f0,(ulong)local_f4);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_load_image_from_hdr_file_data";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3cf7;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 7;
    return __return_storage_ptr__;
  }
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_68 = "rf_load_image_from_hdr_file_data";
  local_60 = 0x3ce4;
  local_88 = 0;
  __n = (size_t)(int)(local_f4 * local_ec * local_f0);
  local_78 = 0;
  rVar1.proc_name._0_4_ = 0x17afb9;
  rVar1.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar1.proc_name._4_4_ = 0;
  rVar1.line_in_file = 0x3ce4;
  auVar4._8_8_ = (ulong)uStack_74 << 0x20;
  auVar4._0_8_ = __n;
  auVar4._16_8_ = 0;
  sStack_80 = __n;
  __dest = (*prVar8)(&local_58,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar4 << 0x40));
  if (__dest == (void *)0x0) {
    local_a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_98 = "rf_load_image_from_hdr_file_data";
    local_90 = 0x3cf3;
    source_location_00.proc_name._0_4_ = 0x17afb9;
    source_location_00.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location_00.proc_name._4_4_ = 0;
    source_location_00.line_in_file = 0x3cf3;
    rf_log_impl(source_location_00,RF_LOG_TYPE_ERROR,"Buffer is not big enough",2,(ulong)uVar6,
                (ulong)uVar5,(ulong)local_f4);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_load_image_from_hdr_file_data";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3cf3;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 2;
    goto LAB_001274f7;
  }
  __return_storage_ptr__->data = __dest;
  __return_storage_ptr__->width = uVar6;
  __return_storage_ptr__->height = uVar5;
  __return_storage_ptr__->valid = true;
  if (local_f4 == 1) {
    rVar7 = RF_UNCOMPRESSED_R32;
LAB_001274df:
    __return_storage_ptr__->format = rVar7;
  }
  else {
    if (local_f4 == 4) {
      rVar7 = RF_UNCOMPRESSED_NORMALIZED;
      goto LAB_001274df;
    }
    if (local_f4 == 3) {
      rVar7 = RF_UNCOMPRESSED_R32G32B32;
      goto LAB_001274df;
    }
  }
  memcpy(__dest,__src,__n);
LAB_001274f7:
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_b0 = "rf_load_image_from_hdr_file_data";
  local_a8 = 0x3cf5;
  uStack_c8 = 0;
  local_c0 = 0;
  rVar2.proc_name._0_4_ = 0x17afb9;
  rVar2.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar2.proc_name._4_4_ = 0;
  rVar2.line_in_file = 0x3cf5;
  rVar3.size_to_allocate_or_reallocate = 0;
  rVar3.pointer_to_free_or_realloc = __src;
  rVar3._16_8_ = (ulong)uStack_bc << 0x20;
  local_d0 = __src;
  (*temp_allocator.allocator_proc)(&temp_allocator,rVar2,RF_AM_FREE,rVar3);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_load_image_from_hdr_file_data(const void* src, rf_int src_size, rf_allocator allocator, rf_allocator temp_allocator)
{
    rf_image result = {0};

    if (src && src_size)
    {
        int width = 0, height = 0, bpp = 0;

        // NOTE: Using stb_image to load images (Supports multiple image formats)
        RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
        void* stbi_result = stbi_load_from_memory(src, src_size, &width, &height, &bpp, RF_ANY_CHANNELS);
        RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

        if (stbi_result && bpp)
        {
            int stbi_result_size = width * height * bpp;
            void* result_buffer = RF_ALLOC(allocator, stbi_result_size);

            if (result_buffer)
            {
                result.data   = result_buffer;
                result.width  = width;
                result.height = height;
                result.valid  = true;

                     if (bpp == 1) result.format = RF_UNCOMPRESSED_R32;
                else if (bpp == 3) result.format = RF_UNCOMPRESSED_R32G32B32;
                else if (bpp == 4) result.format = RF_UNCOMPRESSED_R32G32B32A32;

                memcpy(result_buffer, stbi_result, stbi_result_size);
            }
            else RF_LOG_ERROR(RF_BAD_ALLOC, "Buffer is not big enough", width, height, bpp);

            RF_FREE(temp_allocator, stbi_result);
        }
        else RF_LOG_ERROR(RF_STBI_FAILED, "File format not supported or could not be loaded. STB Image returned { x: %d, y: %d, channels: %d }", width, height, bpp);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Argument `image` was invalid.");

    return result;
}